

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O3

void __thiscall jrtplib::RTPPacketBuilder::Destroy(RTPPacketBuilder *this)

{
  RTPMemoryManager *pRVar1;
  
  if (this->init == true) {
    pRVar1 = (this->super_RTPMemoryObject).mgr;
    if (pRVar1 == (RTPMemoryManager *)0x0) {
      if (this->buffer != (uint8_t *)0x0) {
        operator_delete__(this->buffer);
      }
    }
    else {
      (**(code **)(*(long *)pRVar1 + 0x18))();
    }
    this->init = false;
  }
  return;
}

Assistant:

void RTPPacketBuilder::Destroy()
{
	if (!init)
		return;
	RTPDeleteByteArray(buffer,GetMemoryManager());
	init = false;
}